

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.c++
# Opt level: O0

size_t capnp::computeSerializedSizeInWords
                 (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments)

{
  size_t sVar1;
  ArrayPtr<const_capnp::word> *pAVar2;
  ArrayPtr<const_capnp::word> *segment;
  ArrayPtr<const_capnp::word> *__end1;
  ArrayPtr<const_capnp::word> *__begin1;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *__range1;
  size_t totalSize;
  Fault local_20;
  Fault f;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> segments_local;
  
  f.exception = (Exception *)segments.ptr;
  sVar1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
  if (sVar1 != 0) {
    sVar1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::size
                      ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
    __range1 = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)((sVar1 >> 1) + 1);
    __end1 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::begin
                       ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
    pAVar2 = kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::end
                       ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&f);
    for (; __end1 != pAVar2; __end1 = __end1 + 1) {
      sVar1 = kj::ArrayPtr<const_capnp::word>::size(__end1);
      __range1 = (ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)((long)&__range1->ptr + sVar1);
    }
    return (size_t)__range1;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42]>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize.c++"
             ,0xa0,FAILED,"segments.size() > 0","\"Tried to serialize uninitialized message.\"",
             (char (*) [42])"Tried to serialize uninitialized message.");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

size_t computeSerializedSizeInWords(kj::ArrayPtr<const kj::ArrayPtr<const word>> segments) {
  KJ_REQUIRE(segments.size() > 0, "Tried to serialize uninitialized message.");

  size_t totalSize = segments.size() / 2 + 1;

  for (auto& segment: segments) {
    totalSize += segment.size();
  }

  return totalSize;
}